

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
add_file::add_file(add_file *this,string *srcname,string *filesystemname,string *romname)

{
  (this->super_action)._vptr_action = (_func_int **)&PTR__add_file_001436e0;
  std::__cxx11::string::string((string *)&this->_srcpath,(string *)srcname);
  std::__cxx11::string::string((string *)&this->_fsname,(string *)filesystemname);
  std::__cxx11::string::string((string *)&this->_romname,(string *)romname);
  return;
}

Assistant:

add_file(const std::string&srcname, const std::string& filesystemname, const std::string&romname)
        : _srcpath(srcname), _fsname(filesystemname), _romname(romname)
    {
    }